

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_memory.h
# Opt level: O0

void * mk_mem_alloc_z(size_t size)

{
  void *buf;
  size_t size_local;
  
  size_local = (size_t)calloc(1,size);
  if ((void *)size_local == (void *)0x0) {
    size_local = 0;
  }
  return (void *)size_local;
}

Assistant:

static inline ALLOCSZ_ATTR(1)
void *mk_mem_alloc_z(const size_t size)
{
#ifdef MALLOC_JEMALLOC
    void *buf = je_calloc(1, size);
#else
    void *buf = calloc(1, size);
#endif

    if (mk_unlikely(!buf)) {
        return NULL;
    }

    return buf;
}